

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_lcp_3way<false>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  byte *pbVar1;
  lcp_t *lcp_output_00;
  uchar **strings_output_00;
  lcp_t *lcp_output_01;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  lcp_t *__dest;
  MergeResult MVar6;
  MergeResult MVar7;
  MergeResult MVar8;
  uchar **ppuVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  lcp_t *plVar13;
  uchar **strings_output_01;
  lcp_t *plVar14;
  lcp_t *plVar15;
  uchar **ppuVar16;
  uchar **from0;
  char *__assertion;
  byte bVar17;
  lcp_t lVar18;
  size_t n_00;
  lcp_t in_R9;
  long lVar19;
  size_t n_01;
  undefined1 auVar20 [16];
  double dVar21;
  lcp_t *in_stack_ffffffffffffff38;
  
  if (0x1f < n) {
    auVar20._8_4_ = (int)(n >> 0x20);
    auVar20._0_8_ = n;
    auVar20._12_4_ = 0x45300000;
    uVar12 = n / 3;
    dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.6666666666666666;
    uVar10 = (ulong)dVar21;
    uVar10 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
    MVar6 = mergesort_lcp_3way<true>(strings_input,strings_output,lcp_input,lcp_output,uVar12);
    plVar13 = lcp_input;
    ppuVar9 = strings_input;
    if (MVar6 != SortedInPlace) {
      plVar13 = lcp_output;
      ppuVar9 = strings_output;
    }
    check_input(ppuVar9,plVar13,uVar12);
    ppuVar9 = strings_input + uVar12;
    strings_output_01 = strings_output + uVar12;
    plVar13 = lcp_input + uVar12;
    lcp_output_00 = lcp_output + uVar12;
    n_01 = uVar10 - uVar12;
    MVar7 = mergesort_lcp_3way<true>(ppuVar9,strings_output_01,plVar13,lcp_output_00,n_01);
    plVar14 = plVar13;
    ppuVar16 = ppuVar9;
    if (MVar7 != SortedInPlace) {
      plVar14 = lcp_output_00;
      ppuVar16 = strings_output_01;
    }
    check_input(ppuVar16,plVar14,n_01);
    ppuVar16 = strings_input + uVar10;
    strings_output_00 = strings_output + uVar10;
    plVar14 = lcp_input + uVar10;
    lcp_output_01 = lcp_output + uVar10;
    n_00 = n - uVar10;
    MVar8 = mergesort_lcp_3way<true>(ppuVar16,strings_output_00,plVar14,lcp_output_01,n_00);
    plVar15 = plVar14;
    from0 = ppuVar16;
    if (MVar8 != SortedInPlace) {
      plVar15 = lcp_output_01;
      from0 = strings_output_00;
    }
    check_input(from0,plVar15,n_00);
    lVar19 = uVar10 * 8;
    if (MVar6 != MVar7) {
      sVar11 = uVar12 * 8;
      if (MVar7 == MVar8) {
        if (MVar6 == SortedInPlace) {
          memcpy(strings_output,strings_input,sVar11);
          memcpy(lcp_output,lcp_input,sVar11);
          MVar6 = SortedInTemp;
        }
        else {
          memcpy(strings_input,strings_output,sVar11);
          memcpy(lcp_input,lcp_output,sVar11);
          MVar6 = SortedInPlace;
        }
      }
      else {
        if (MVar7 == SortedInPlace) {
          sVar11 = lVar19 + uVar12 * -8;
          if (sVar11 != 0) {
            memcpy(strings_output_01,ppuVar9,sVar11);
          }
          MVar7 = SortedInTemp;
          plVar15 = plVar13;
          __dest = lcp_output_00;
        }
        else {
          sVar11 = lVar19 + uVar12 * -8;
          if (sVar11 != 0) {
            memcpy(ppuVar9,strings_output_01,sVar11);
          }
          MVar7 = SortedInPlace;
          plVar15 = lcp_output_00;
          __dest = plVar13;
        }
        sVar11 = lVar19 + uVar12 * -8;
        if (sVar11 != 0) {
          memcpy(__dest,plVar15,sVar11);
        }
      }
    }
    if (MVar7 != MVar8) {
      lVar19 = n * 8;
      if (MVar8 == SortedInPlace) {
        sVar11 = lVar19 + uVar10 * -8;
        if (sVar11 != 0) {
          memcpy(strings_output_00,ppuVar16,sVar11);
        }
        MVar8 = SortedInTemp;
        sVar11 = lVar19 + uVar10 * -8;
        if (sVar11 != 0) {
          memcpy(lcp_output_01,plVar14,sVar11);
        }
      }
      else {
        sVar11 = lVar19 + uVar10 * -8;
        if (sVar11 != 0) {
          memcpy(ppuVar16,strings_output_00,sVar11);
        }
        MVar8 = SortedInPlace;
        sVar11 = lVar19 + uVar10 * -8;
        if (sVar11 != 0) {
          memcpy(plVar14,lcp_output_01,sVar11);
          MVar8 = SortedInPlace;
        }
      }
    }
    if (MVar6 == MVar7) {
      if (MVar7 == MVar8) {
        if (MVar6 != SortedInPlace) {
          merge_lcp_3way<false>
                    (strings_output,lcp_output,uVar12,strings_output_01,lcp_output_00,n_01,
                     strings_output_00,lcp_output_01,n_00,strings_input,in_stack_ffffffffffffff38);
          return SortedInPlace;
        }
        merge_lcp_3way<false>
                  (strings_input,lcp_input,uVar12,ppuVar9,plVar13,n_01,ppuVar16,plVar14,n_00,
                   strings_output,in_stack_ffffffffffffff38);
        return SortedInTemp;
      }
      __assertion = "m1 == m2";
    }
    else {
      __assertion = "m0 == m1";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x31d,
                  "MergeResult mergesort_lcp_3way(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
                 );
  }
  if (1 < (long)n) {
    uVar10 = n & 0xffffffff;
    ppuVar9 = strings_input;
    do {
      iVar4 = (int)uVar10;
      uVar10 = (ulong)(iVar4 - 1);
      pbVar2 = ppuVar9[1];
      ppuVar9 = ppuVar9 + 1;
      for (ppuVar16 = ppuVar9; strings_input < ppuVar16; ppuVar16 = ppuVar16 + -1) {
        pbVar3 = ppuVar16[-1];
        bVar17 = *pbVar3;
        in_R9 = CONCAT71((int7)(in_R9 >> 8),*pbVar2);
        if (bVar17 != 0 && bVar17 == *pbVar2) {
          lVar19 = 1;
          do {
            bVar17 = pbVar3[lVar19];
            pbVar1 = pbVar2 + lVar19;
            in_R9 = CONCAT71((int7)(in_R9 >> 8),*pbVar1);
            if (bVar17 == 0) break;
            lVar19 = lVar19 + 1;
          } while (bVar17 == *pbVar1);
        }
        if (bVar17 <= (byte)in_R9) break;
        *ppuVar16 = pbVar3;
      }
      *ppuVar16 = pbVar2;
    } while (2 < iVar4);
  }
  if (n != 1) {
    uVar10 = 0;
    do {
      uVar12 = (ulong)((int)uVar10 + 1);
      lVar19 = 0;
      lVar18 = 0;
      do {
        if ((strings_input[uVar10][lVar19] == '\0') ||
           (strings_input[uVar10][lVar19] != strings_input[uVar12][lVar19])) {
          bVar5 = false;
          in_R9 = lVar18;
        }
        else {
          lVar18 = lVar18 + 1;
          bVar5 = true;
        }
        lVar19 = lVar19 + 1;
      } while (bVar5);
      lcp_input[uVar10] = in_R9;
      uVar10 = uVar12;
    } while (uVar12 < n - 1);
  }
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_lcp_3way(unsigned char** restrict strings_input,
                   unsigned char** restrict strings_output,
                   lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
                   size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/3,
	             split1 = size_t((2.0/3.0)*n);
	MergeResult m0 = mergesort_lcp_3way<true>(
			strings_input,        strings_output,
			lcp_input,            lcp_output,
			split0);
	debug() << __func__ << "(): checking first merge\n";
	if (m0 == SortedInPlace) check_input(strings_input,  lcp_input,  split0);
	else                     check_input(strings_output, lcp_output, split0);
	MergeResult m1 = mergesort_lcp_3way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			split1-split0);
	debug() << __func__ << "(): checking second merge\n";
	if (m1 == SortedInPlace) check_input(strings_input+split0,  lcp_input+split0,  split1-split0);
	else                     check_input(strings_output+split0, lcp_output+split0, split1-split0);
	MergeResult m2 = mergesort_lcp_3way<true>(
			strings_input+split1, strings_output+split1,
			lcp_input+split1,     lcp_output+split1,
			n-split1);
	debug() << __func__ << "(): checking third merge\n";
	if (m2 == SortedInPlace) check_input(strings_input+split1,  lcp_input+split1,  n-split1);
	else                     check_input(strings_output+split1, lcp_output+split1, n-split1);
	debug() << __func__ << "(): m0="<<m0<<", m1="<<m1<<", m2="<<m2<<"\n";
	if (m0 != m1) {
		if (m1 != m2) {
			// m0 == m2 != m1
			if (m1 == SortedInPlace) {
				std::copy(strings_input+split0, strings_input+split1,
						strings_output+split0);
				std::copy(lcp_input+split0, lcp_input+split1,
						lcp_output+split0);
				m1 = SortedInTemp;
			} else {
				std::copy(strings_output+split0, strings_output+split1,
						strings_input+split0);
				std::copy(lcp_output+split0, lcp_output+split1,
						lcp_input+split0);
				m1 = SortedInPlace;
			}
		} else {
			// m0 != m1 == m2
			if (m0 == SortedInPlace) {
				std::copy(strings_input, strings_input+split0,
						strings_output);
				std::copy(lcp_input, lcp_input+split0,
						lcp_output);
				m0 = SortedInTemp;
			} else {
				std::copy(strings_output, strings_output+split0,
						strings_input);
				std::copy(lcp_output, lcp_output+split0,
						lcp_input);
				m0 = SortedInPlace;
			}
		}
	}
	if (m1 != m2) {
		if (m2 == SortedInPlace) {
			std::copy(strings_input+split1, strings_input+n,
					strings_output+split1);
			std::copy(lcp_input+split1, lcp_input+n,
					lcp_output+split1);
			m2 = SortedInTemp;
		} else {
			std::copy(strings_output+split1, strings_output+n,
					strings_input+split1);
			std::copy(lcp_output+split1, lcp_output+n,
					lcp_input+split1);
			m2 = SortedInPlace;
		}
	}
	assert(m0 == m1); assert(m1 == m2);
	if (m0 == SortedInPlace) {
		merge_lcp_3way<OutputLCP>(
			   strings_input,        lcp_input,        split0,
			   strings_input+split0, lcp_input+split0, split1-split0,
			   strings_input+split1, lcp_input+split1, n-split1,
			   strings_output, lcp_output);
		//debug() << __func__ << "(): checking merged result, in -> out\n";
		if (OutputLCP) check_input(strings_output, lcp_output, n);
		return SortedInTemp;
	} else {
		merge_lcp_3way<OutputLCP>(
			   strings_output,        lcp_output,        split0,
			   strings_output+split0, lcp_output+split0, split1-split0,
			   strings_output+split1, lcp_output+split1, n-split1,
			   strings_input, lcp_input);
		//debug() << __func__ << "(): checking merged result, out -> in\n";
		if (OutputLCP) check_input(strings_input, lcp_input, n);
		return SortedInPlace;
	}
}